

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O2

double * u_mass_matrix(int n)

{
  double *t;
  double *w;
  double *b;
  double *a;
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  uint n_00;
  
  n_00 = n + 1;
  uVar5 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar5 = (ulong)n_00 * 8;
  }
  t = (double *)operator_new__(uVar5);
  w = (double *)operator_new__(uVar5);
  u_quadrature_rule(n_00,t,w);
  b = u_polynomial(n_00,n,t);
  a = (double *)operator_new__((ulong)(n_00 * n_00) << 3);
  pdVar1 = b;
  pdVar3 = a;
  for (lVar2 = 0; lVar2 <= n; lVar2 = lVar2 + 1) {
    pdVar4 = pdVar1;
    for (uVar5 = 0; n_00 != uVar5; uVar5 = uVar5 + 1) {
      pdVar3[uVar5] = w[lVar2] * *pdVar4;
      pdVar4 = pdVar4 + (int)n_00;
    }
    pdVar3 = pdVar3 + (int)n_00;
    pdVar1 = pdVar1 + 1;
  }
  pdVar1 = r8mat_mm_new(n_00,n_00,n_00,a,b);
  if (b != (double *)0x0) {
    operator_delete__(b);
  }
  operator_delete__(a);
  operator_delete__(w);
  operator_delete__(t);
  return pdVar1;
}

Assistant:

double *u_mass_matrix ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    U_MASS_MATRIX computes the mass matrix for the Chebyshev U polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 July 2015
//
//  Author:
//
//    John Burkardt
//
{
  double *a;
  int i;
  int k;
  double *phi;
  double *phiw;
  double *w;
  double *x;

  x = new double[n+1];
  w = new double[n+1];

  u_quadrature_rule ( n + 1, x, w );

  phi = u_polynomial ( n + 1, n, x );

  phiw = new double[(n+1)*(n+1)];

  for ( k = 0; k <= n; k++ )
  {
    for ( i = 0; i <= n; i++ )
    {
      phiw[i+k*(n+1)] = w[k] * phi[k+i*(n+1)];
    }
  }

  a = r8mat_mm_new ( n + 1, n + 1, n + 1, phiw, phi );
//
//  Free memory.
//
  delete [] phi;
  delete [] phiw;
  delete [] w;
  delete [] x;

  return a;
}